

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O3

int Wln_RetComputeFfClasses(Wln_Ntk_t *pNtk,Vec_Int_t *vClasses)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  uint *__ptr;
  Vec_Int_t *p;
  int *piVar4;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *paVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  uint *puVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  void *local_80;
  
  uVar10 = 9;
  while( true ) {
    do {
      uVar8 = uVar10;
      uVar10 = uVar8 + 1;
    } while ((uVar8 & 1) != 0);
    if (uVar10 < 9) break;
    iVar6 = 5;
    while (uVar10 % (iVar6 - 2U) != 0) {
      uVar2 = iVar6 * iVar6;
      iVar6 = iVar6 + 2;
      if (uVar10 < uVar2) goto LAB_0038a2cd;
    }
  }
LAB_0038a2cd:
  __ptr = (uint *)malloc(0x10);
  uVar2 = 0x10;
  if (0xe < uVar8) {
    uVar2 = uVar10;
  }
  *__ptr = uVar2;
  local_80 = malloc((long)(int)uVar2 << 2);
  *(void **)(__ptr + 2) = local_80;
  __ptr[1] = uVar10;
  if (local_80 != (void *)0x0) {
    memset(local_80,0xff,(long)(int)uVar10 << 2);
  }
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 0x28;
  p->nSize = 0;
  piVar4 = (int *)malloc(0xa0);
  p->pArray = piVar4;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 0x10;
  p_00->nSize = 0;
  piVar4 = (int *)malloc(0x40);
  p_00->pArray = piVar4;
  p_01 = (Vec_Int_t *)malloc(0x10);
  p_01->nCap = 0x10;
  p_01->nSize = 0;
  piVar4 = (int *)malloc(0x40);
  p_01->pArray = piVar4;
  uVar10 = (pNtk->vTypes).nSize;
  if (vClasses->nCap < (int)uVar10) {
    if (vClasses->pArray == (int *)0x0) {
      piVar4 = (int *)malloc((long)(int)uVar10 << 2);
    }
    else {
      piVar4 = (int *)realloc(vClasses->pArray,(long)(int)uVar10 << 2);
    }
    vClasses->pArray = piVar4;
    if (piVar4 == (int *)0x0) {
LAB_0038a8fe:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    vClasses->nCap = uVar10;
  }
  if (0 < (int)uVar10) {
    memset(vClasses->pArray,0xff,(ulong)uVar10 * 4);
  }
  vClasses->nSize = uVar10;
  if ((pNtk->vFfs).nSize < 1) {
    uVar16 = 0;
  }
  else {
    uVar16 = 0;
    lVar9 = 0;
    do {
      iVar6 = (pNtk->vFfs).pArray[lVar9];
      p_01->nSize = 0;
      lVar14 = 1;
      lVar15 = 4;
      do {
        paVar5 = &pNtk->vFanins[iVar6].field_2;
        if (pNtk->vFanins[iVar6].nSize < 3) {
          piVar4 = paVar5->Array + lVar14;
        }
        else {
          piVar4 = (int *)((long)paVar5->pArray[0] + lVar15);
        }
        Vec_IntPush(p_01,*piVar4);
        lVar14 = lVar14 + 1;
        lVar15 = lVar15 + 4;
      } while (lVar15 != 0x1c);
      uVar10 = __ptr[1];
      if ((int)uVar10 < (int)uVar16) {
        uVar10 = uVar10 * 2 - 1;
        while( true ) {
          do {
            uVar8 = uVar10;
            uVar10 = uVar8 + 1;
          } while ((uVar8 & 1) != 0);
          if (uVar10 < 9) break;
          iVar7 = 5;
          while (uVar10 % (iVar7 - 2U) != 0) {
            uVar2 = iVar7 * iVar7;
            iVar7 = iVar7 + 2;
            if (uVar10 < uVar2) goto LAB_0038a4d1;
          }
        }
LAB_0038a4d1:
        if ((int)*__ptr < (int)uVar10) {
          if (local_80 == (void *)0x0) {
            local_80 = malloc((long)(int)uVar10 << 2);
          }
          else {
            local_80 = realloc(local_80,(long)(int)uVar10 << 2);
          }
          *(void **)(__ptr + 2) = local_80;
          if (local_80 == (void *)0x0) goto LAB_0038a8fe;
          *__ptr = uVar10;
        }
        if (uVar8 < 0x7fffffff) {
          memset(local_80,0xff,(ulong)uVar10 << 2);
          uVar16 = (ulong)(uint)p_00->nSize;
        }
        __ptr[1] = uVar10;
        if (0 < (int)uVar16) {
          piVar4 = p_00->pArray;
          lVar14 = 0;
          do {
            iVar7 = piVar4[lVar14];
            if (((long)iVar7 < 0) || (p->nSize <= iVar7)) goto LAB_0038a882;
            piVar1 = p->pArray + iVar7;
            if ((long)*piVar1 < 1) {
              uVar8 = 0;
            }
            else {
              uVar12 = 0;
              uVar8 = 0;
              do {
                uVar8 = uVar8 + (&Hsh_VecManHash_s_Primes)[uVar12 % 7] * piVar1[uVar12 + 2];
                uVar12 = uVar12 + 1;
              } while ((long)*piVar1 != uVar12);
            }
            uVar12 = (ulong)uVar8 % (ulong)uVar10;
            if (((int)uVar12 < 0) || ((int)uVar10 <= (int)uVar12)) goto LAB_0038a882;
            if ((int)uVar16 <= lVar14) goto LAB_0038a8a1;
            piVar1[1] = *(int *)((long)local_80 + uVar12 * 4);
            *(int *)((long)local_80 + uVar12 * 4) = (int)lVar14;
            lVar14 = lVar14 + 1;
            uVar16 = (ulong)p_00->nSize;
          } while (lVar14 < (long)uVar16);
        }
      }
      iVar7 = p_01->nSize;
      uVar12 = (ulong)iVar7;
      if ((long)uVar12 < 1) {
        uVar8 = 0;
      }
      else {
        uVar13 = 0;
        uVar8 = 0;
        do {
          uVar8 = uVar8 + (&Hsh_VecManHash_s_Primes)[uVar13 % 7] * p_01->pArray[uVar13];
          uVar13 = uVar13 + 1;
        } while (uVar12 != uVar13);
      }
      iVar3 = (int)((ulong)uVar8 % (ulong)uVar10);
      if ((iVar3 < 0) || ((int)uVar10 <= iVar3)) {
LAB_0038a882:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      puVar11 = (uint *)((long)local_80 + ((ulong)uVar8 % (ulong)uVar10) * 4);
      uVar10 = *puVar11;
      if (uVar10 != 0xffffffff) {
        do {
          if (((int)uVar10 < 0) || ((int)(uint)uVar16 <= (int)uVar10)) {
LAB_0038a8a1:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar3 = p_00->pArray[uVar10];
          if (((long)iVar3 < 0) || (p->nSize <= iVar3)) goto LAB_0038a882;
          if (p->pArray == (int *)0x0) break;
          piVar4 = p->pArray + iVar3;
          if ((*piVar4 == iVar7) && (iVar3 = bcmp(piVar4 + 2,p_01->pArray,uVar12 << 2), iVar3 == 0))
          goto LAB_0038a7a3;
          uVar10 = piVar4[1];
          puVar11 = (uint *)(piVar4 + 1);
        } while (uVar10 != 0xffffffff);
      }
      *puVar11 = (uint)uVar16;
      if ((p->nSize & 1U) != 0) {
        __assert_fail("Vec_IntSize(p->vData) % 2 == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecHsh.h"
                      ,0x216,"int Hsh_VecManAdd(Hsh_VecMan_t *, Vec_Int_t *)");
      }
      Vec_IntPush(p_00,p->nSize);
      uVar16 = (ulong)p_01->nSize;
      Vec_IntPush(p,p_01->nSize);
      Vec_IntPush(p,-1);
      if (0 < (long)uVar16) {
        piVar4 = p_01->pArray;
        uVar12 = 0;
        do {
          Vec_IntPush(p,piVar4[uVar12]);
          uVar12 = uVar12 + 1;
        } while (uVar16 != uVar12);
      }
      if ((uVar16 & 1) != 0) {
        Vec_IntPush(p,-1);
      }
      uVar16 = (ulong)(uint)p_00->nSize;
      uVar10 = p_00->nSize - 1;
LAB_0038a7a3:
      if ((iVar6 < 0) || (vClasses->nSize <= iVar6)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      vClasses->pArray[iVar6] = uVar10;
      lVar9 = lVar9 + 1;
    } while (lVar9 < (pNtk->vFfs).nSize);
  }
  if (local_80 != (void *)0x0) {
    free(local_80);
  }
  free(__ptr);
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
  }
  free(p);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  if (p_01->pArray != (int *)0x0) {
    free(p_01->pArray);
  }
  free(p_01);
  printf("Detected %d flops and %d flop classes.\n",(ulong)(uint)(pNtk->vFfs).nSize,
         uVar16 & 0xffffffff);
  return (int)uVar16;
}

Assistant:

int Wln_RetComputeFfClasses( Wln_Ntk_t * pNtk, Vec_Int_t * vClasses )
{
    int i, k, iObj, nClasses;
    Hsh_VecMan_t * p = Hsh_VecManStart( 10 );
    Vec_Int_t * vFlop = Vec_IntAlloc( 6 ); 
    Vec_IntFill( vClasses, Wln_NtkObjNum(pNtk), -1 );
    Wln_NtkForEachFf( pNtk, iObj, i )
    {
        Vec_IntClear( vFlop );
        for ( k = 1; k <= 6; k++ )
            Vec_IntPush( vFlop, Wln_ObjFanin(pNtk, iObj, k) );
        Vec_IntWriteEntry( vClasses, iObj, Hsh_VecManAdd(p, vFlop) );
    }
    nClasses = Hsh_VecSize( p );
    Hsh_VecManStop( p );
    Vec_IntFree( vFlop );
    printf( "Detected %d flops and %d flop classes.\n", Wln_NtkFfNum(pNtk), nClasses );
    return nClasses;
}